

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

LoadFileStatus lf_load(LoadedFile *lf,Filename *filename)

{
  LoadFileStatus LVar1;
  FILE *__stream;
  
  __stream = (FILE *)f_open(filename,"rb",false);
  if (__stream == (FILE *)0x0) {
    LVar1 = LF_ERROR;
  }
  else {
    LVar1 = lf_load_fp(lf,(FILE *)__stream);
    fclose(__stream);
  }
  return LVar1;
}

Assistant:

LoadFileStatus lf_load(LoadedFile *lf, const Filename *filename)
{
    FILE *fp = f_open(filename, "rb", false);
    if (!fp)
        return LF_ERROR;

    LoadFileStatus status = lf_load_fp(lf, fp);
    fclose(fp);
    return status;
}